

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.cpp
# Opt level: O2

void __thiscall ThreadPool::Start(ThreadPool *this,int threadNum)

{
  vector<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
  *this_00;
  Thread *this_01;
  ulong uVar1;
  ulong uVar2;
  Thread *local_70;
  _Bind<void_(ThreadPool::*(ThreadPool_*))()> local_68;
  CallFunc local_50;
  
  if (this->m_bRunning == true) {
    Stop(this);
  }
  this_00 = &this->m_threads;
  std::
  vector<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
  ::reserve(this_00,(long)threadNum);
  this->m_bRunning = true;
  uVar1 = 0;
  uVar2 = (ulong)(uint)threadNum;
  if (threadNum < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    this_01 = (Thread *)operator_new(0x30);
    local_68._M_f = (offset_in_ThreadPool_to_subr)RunInThread;
    local_68._8_8_ = 0;
    local_68._M_bound_args.super__Tuple_impl<0UL,_ThreadPool_*>.
    super__Head_base<0UL,_ThreadPool_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_ThreadPool_*>)(_Tuple_impl<0UL,_ThreadPool_*>)this;
    std::function<void()>::function<std::_Bind<void(ThreadPool::*(ThreadPool*))()>,void>
              ((function<void()> *)&local_50,&local_68);
    Thread::Thread(this_01,&local_50);
    local_70 = this_01;
    std::
    vector<std::unique_ptr<Thread,std::default_delete<Thread>>,std::allocator<std::unique_ptr<Thread,std::default_delete<Thread>>>>
    ::emplace_back<Thread*>
              ((vector<std::unique_ptr<Thread,std::default_delete<Thread>>,std::allocator<std::unique_ptr<Thread,std::default_delete<Thread>>>>
                *)this_00,&local_70);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    Thread::Start((Thread *)
                  (this_00->
                  super__Vector_base<std::unique_ptr<Thread,_std::default_delete<Thread>_>,_std::allocator<std::unique_ptr<Thread,_std::default_delete<Thread>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar1]._M_t.
                  super___uniq_ptr_impl<Thread,_std::default_delete<Thread>_>);
  }
  return;
}

Assistant:

void ThreadPool::Start(int threadNum)
{
	if (m_bRunning)
	{
		Stop();
	}
	
	m_threads.reserve(threadNum);
	m_bRunning = true;
	for (int i = 0; i < threadNum; ++i)
	{
		m_threads.emplace_back(new Thread(std::bind(&ThreadPool::RunInThread, this)));
		m_threads[i]->Start();
	}
}